

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void Prn_gen<Blob<128>>(int nbRn,pfHash hash,vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes)

{
  code *in_RSI;
  int in_EDI;
  Blob<128> h;
  int i;
  Blob<128> hcopy;
  undefined1 local_3c [4];
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  Blob<128> local_28;
  code *local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  printf("Generating %i random numbers : \n");
  Blob<128>::Blob(&local_28);
  memset(&local_28,0,0x10);
  for (iVar1 = 0; iVar1 < local_4; iVar1 = iVar1 + 1) {
    Blob<128>::Blob((Blob<128> *)local_3c);
    (*local_10)(&local_28,0x10,0,local_3c);
    std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back
              ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
               CONCAT44(iVar1,in_stack_ffffffffffffffd0),
               (value_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  return;
}

Assistant:

void Prn_gen (int nbRn, pfHash hash, std::vector<hashtype> & hashes )
{
  assert(nbRn < 0);

  printf("Generating %i random numbers : \n", nbRn);

  hashtype hcopy;
  memset(&hcopy, 0, sizeof(hcopy));

  // a generated random number becomes the input for the next one
  for (int i=0; i< nbRn; i++) {
      hashtype h;
      hash(&hcopy, sizeof(hcopy), 0, &h);
      hashes.push_back(h);
      memcpy(&hcopy, &h, sizeof(h));
  }
}